

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ConstantPaddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_constantpad(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x483) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x483;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ConstantPaddingLayerParams::ConstantPaddingLayerParams(this_00.constantpad_);
    (this->layer_).constantpad_ = (ConstantPaddingLayerParams *)this_00;
  }
  return (ConstantPaddingLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ConstantPaddingLayerParams* NeuralNetworkLayer::mutable_constantpad() {
  if (!has_constantpad()) {
    clear_layer();
    set_has_constantpad();
    layer_.constantpad_ = new ::CoreML::Specification::ConstantPaddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.constantPad)
  return layer_.constantpad_;
}